

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ameth.c
# Opt level: O3

int register_ameth_gost(int nid,EVP_PKEY_ASN1_METHOD **ameth,char *pemstr,char *info)

{
  EVP_PKEY_ASN1_METHOD *ameth_00;
  code *pcVar1;
  code *pcVar2;
  EVP_PKEY_ASN1_METHOD *pEVar3;
  code *pcVar4;
  
  ameth_00 = EVP_PKEY_asn1_new(nid,4,pemstr,info);
  *ameth = (EVP_PKEY_ASN1_METHOD *)ameth_00;
  if (ameth_00 == (EVP_PKEY_ASN1_METHOD *)0x0) {
    return 0;
  }
  if (nid < 0x3d3) {
    if (nid < 0x331) {
      if (nid == 0x32b) {
LAB_001129a2:
        EVP_PKEY_asn1_set_free(ameth_00,pkey_free_gost_ec);
        EVP_PKEY_asn1_set_private
                  ((EVP_PKEY_ASN1_METHOD *)*ameth,priv_decode_gost,priv_encode_gost,
                   priv_print_gost_ec);
        pEVar3 = *ameth;
        pcVar4 = param_print_gost_ec;
        pcVar2 = gost2001_param_decode;
        pcVar1 = gost2001_param_encode;
        goto LAB_00112a51;
      }
      if (nid != 0x32f) {
        return 1;
      }
      EVP_PKEY_asn1_set_free(ameth_00,mackey_free_gost);
      pEVar3 = *ameth;
      pcVar1 = mac_ctrl_gost;
    }
    else {
      if (nid == 0x331) goto LAB_001129a2;
      if (nid != 0x3d0) {
        return 1;
      }
      EVP_PKEY_asn1_set_free(ameth_00,mackey_free_gost);
      pEVar3 = *ameth;
      pcVar1 = mac_ctrl_gost_12;
    }
LAB_00112ac1:
    EVP_PKEY_asn1_set_ctrl((EVP_PKEY_ASN1_METHOD *)pEVar3,pcVar1);
  }
  else {
    if (1 < nid - 0x3d3U) {
      if (nid == 0x3f9) {
        EVP_PKEY_asn1_set_free(ameth_00,mackey_free_gost);
        pEVar3 = *ameth;
        pcVar1 = mac_ctrl_grasshopper;
      }
      else {
        if (nid != 0x4a8) {
          return 1;
        }
        EVP_PKEY_asn1_set_free(ameth_00,mackey_free_gost);
        pEVar3 = *ameth;
        pcVar1 = mac_ctrl_magma;
      }
      goto LAB_00112ac1;
    }
    EVP_PKEY_asn1_set_free(ameth_00,pkey_free_gost_ec);
    EVP_PKEY_asn1_set_private
              ((EVP_PKEY_ASN1_METHOD *)*ameth,priv_decode_gost,priv_encode_gost,priv_print_gost_ec);
    pEVar3 = *ameth;
    pcVar4 = (param_print *)0x0;
    pcVar2 = (param_decode *)0x0;
    pcVar1 = (param_encode *)0x0;
LAB_00112a51:
    EVP_PKEY_asn1_set_param
              ((EVP_PKEY_ASN1_METHOD *)pEVar3,pcVar2,pcVar1,param_missing_gost_ec,param_copy_gost_ec
               ,param_cmp_gost_ec,pcVar4);
    EVP_PKEY_asn1_set_public
              ((EVP_PKEY_ASN1_METHOD *)*ameth,pub_decode_gost_ec,pub_encode_gost_ec,pub_cmp_gost_ec,
               pub_print_gost_ec,pkey_size_gost,pkey_bits_gost);
    EVP_PKEY_asn1_set_ctrl((EVP_PKEY_ASN1_METHOD *)*ameth,pkey_ctrl_gost);
    EVP_PKEY_asn1_set_security_bits(*ameth,pkey_bits_gost);
  }
  return 1;
}

Assistant:

int register_ameth_gost(int nid, EVP_PKEY_ASN1_METHOD **ameth,
                        const char *pemstr, const char *info)
{
    *ameth = EVP_PKEY_asn1_new(nid, ASN1_PKEY_SIGPARAM_NULL, pemstr, info);
    if (!*ameth)
        return 0;
    switch (nid) {
    case NID_id_GostR3410_2001:
    case NID_id_GostR3410_2001DH:
        EVP_PKEY_asn1_set_free(*ameth, pkey_free_gost_ec);
        EVP_PKEY_asn1_set_private(*ameth,
                                  priv_decode_gost, priv_encode_gost,
                                  priv_print_gost_ec);

        EVP_PKEY_asn1_set_param(*ameth,
                                gost2001_param_decode, gost2001_param_encode,
                                param_missing_gost_ec, param_copy_gost_ec,
                                param_cmp_gost_ec, param_print_gost_ec);
        EVP_PKEY_asn1_set_public(*ameth,
                                 pub_decode_gost_ec, pub_encode_gost_ec,
                                 pub_cmp_gost_ec, pub_print_gost_ec,
                                 pkey_size_gost, pkey_bits_gost);

        EVP_PKEY_asn1_set_ctrl(*ameth, pkey_ctrl_gost);
        EVP_PKEY_asn1_set_security_bits(*ameth, pkey_bits_gost);
        break;
    case NID_id_GostR3410_2012_256:
    case NID_id_GostR3410_2012_512:
        EVP_PKEY_asn1_set_free(*ameth, pkey_free_gost_ec);
        EVP_PKEY_asn1_set_private(*ameth,
                                  priv_decode_gost, priv_encode_gost,
                                  priv_print_gost_ec);

        EVP_PKEY_asn1_set_param(*ameth,
                                NULL, NULL,
                                param_missing_gost_ec, param_copy_gost_ec,
                                param_cmp_gost_ec, NULL);

        EVP_PKEY_asn1_set_public(*ameth,
                                 pub_decode_gost_ec, pub_encode_gost_ec,
                                 pub_cmp_gost_ec, pub_print_gost_ec,
                                 pkey_size_gost, pkey_bits_gost);

        EVP_PKEY_asn1_set_ctrl(*ameth, pkey_ctrl_gost);
        EVP_PKEY_asn1_set_security_bits(*ameth, pkey_bits_gost);
        break;
    case NID_id_Gost28147_89_MAC:
        EVP_PKEY_asn1_set_free(*ameth, mackey_free_gost);
        EVP_PKEY_asn1_set_ctrl(*ameth, mac_ctrl_gost);
        break;
    case NID_gost_mac_12:
        EVP_PKEY_asn1_set_free(*ameth, mackey_free_gost);
        EVP_PKEY_asn1_set_ctrl(*ameth, mac_ctrl_gost_12);
        break;
    case NID_magma_mac:
        EVP_PKEY_asn1_set_free(*ameth, mackey_free_gost);
        EVP_PKEY_asn1_set_ctrl(*ameth, mac_ctrl_magma);
        break;
    case NID_grasshopper_mac:
        EVP_PKEY_asn1_set_free(*ameth, mackey_free_gost);
        EVP_PKEY_asn1_set_ctrl(*ameth, mac_ctrl_grasshopper);
        break;
    }
    return 1;
}